

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_hotspot.cxx
# Opt level: O0

void __thiscall Fl_Window::hotspot(Fl_Window *this,int X,int Y,int offscreen)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int local_44;
  int local_40;
  int bottom;
  int right;
  int left;
  int top;
  int scr_h;
  int scr_w;
  int scr_y;
  int scr_x;
  int my;
  int mx;
  int offscreen_local;
  int Y_local;
  int X_local;
  Fl_Window *this_local;
  
  my = offscreen;
  mx = Y;
  offscreen_local = X;
  _Y_local = this;
  Fl::get_mouse(&scr_x,&scr_y);
  offscreen_local = scr_x - offscreen_local;
  mx = scr_y - mx;
  if (my == 0) {
    Fl::screen_work_area(&scr_w,&scr_h,&top,&left);
    right = 0;
    bottom = 0;
    local_40 = 0;
    local_44 = 0;
    uVar1 = border(this);
    iVar3 = offscreen_local;
    if (uVar1 != 0) {
      right = 0x14;
      bottom = 4;
      local_40 = 4;
      local_44 = 8;
    }
    iVar2 = Fl_Widget::w((Fl_Widget *)this);
    if (top + scr_w < iVar3 + iVar2 + local_40) {
      iVar3 = top + scr_w;
      iVar2 = Fl_Widget::w((Fl_Widget *)this);
      offscreen_local = (iVar3 - local_40) - iVar2;
    }
    iVar3 = mx;
    if (offscreen_local - bottom < scr_w) {
      offscreen_local = bottom + scr_w;
    }
    iVar2 = Fl_Widget::h((Fl_Widget *)this);
    if (left + scr_h < iVar3 + iVar2 + local_44) {
      iVar3 = left + scr_h;
      iVar2 = Fl_Widget::h((Fl_Widget *)this);
      mx = (iVar3 - local_44) - iVar2;
    }
    iVar3 = offscreen_local;
    if (mx - right < scr_h) {
      mx = right + scr_h;
    }
    iVar2 = Fl_Widget::x((Fl_Widget *)this);
    if (iVar3 == iVar2) {
      Fl_Widget::x((Fl_Widget *)this,offscreen_local + -1);
    }
  }
  Fl_Widget::position((Fl_Widget *)this,offscreen_local,mx);
  return;
}

Assistant:

void Fl_Window::hotspot(int X, int Y, int offscreen) {
  int mx,my;

  // Update the screen position based on the mouse position.
  Fl::get_mouse(mx,my);
  X = mx-X; Y = my-Y;

  // If offscreen is 0 (the default), make sure that the window
  // stays on the screen, if possible.
  if (!offscreen) {
    int scr_x, scr_y, scr_w, scr_h;
    Fl::screen_work_area(scr_x, scr_y, scr_w, scr_h);

    int top = 0;
    int left = 0;
    int right = 0;
    int bottom = 0;

    if (border()) {
#ifdef WIN32
      if (size_range_set && (maxw != minw || maxh != minh)) {
        left = right = GetSystemMetrics(SM_CXSIZEFRAME);
        top = bottom = GetSystemMetrics(SM_CYSIZEFRAME);
      } else {
        left = right = GetSystemMetrics(SM_CXFIXEDFRAME); 
        top = bottom = GetSystemMetrics(SM_CYFIXEDFRAME);
      }
      top += GetSystemMetrics(SM_CYCAPTION);
#elif defined(__APPLE__)
      top = 24;
      left = 2;
      right = 2;
      bottom = 2;
#else
      // Ensure border is on screen; these values are generic enough
      // to work with many window managers, and are based on KDE defaults.
      top = 20;
      left = 4;
      right = 4;
      bottom = 8;
#endif
    }
    // now insure contents are on-screen (more important than border):
    if (X+w()+right > scr_w+scr_x) X = scr_w+scr_x-right-w();
    if (X-left < scr_x) X = left + scr_x;
    if (Y+h()+bottom > scr_h+scr_y) Y = scr_h+scr_y-bottom-h();
    if (Y-top < scr_y) Y = top + scr_y;
    // make sure that we will force this position
    if (X==x()) x(X-1);
  }

  position(X,Y);
}